

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void statlist(LexState *ls)

{
  uint uVar1;
  
  do {
    uVar1 = (ls->t).token - 0x104;
    if (uVar1 < 0x1b) {
      if ((0x4020007U >> (uVar1 & 0x1f) & 1) != 0) {
        return;
      }
      if (uVar1 == 0xe) {
        statement(ls);
        return;
      }
    }
    statement(ls);
  } while( true );
}

Assistant:

static void statlist (LexState *ls) {
  /* statlist -> { stat [`;'] } */
  while (!block_follow(ls, 1)) {
    if (ls->t.token == TK_RETURN) {
      statement(ls);
      return;  /* 'return' must be last statement */
    }
    statement(ls);
  }
}